

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_fxaashader.cpp
# Opt level: O0

void __thiscall FFXAAShader::Bind(FFXAAShader *this)

{
  bool bVar1;
  GLuint GVar2;
  FFXAAShader *this_local;
  
  bVar1 = FShaderProgram::operator_cast_to_bool(&this->mShader);
  if (!bVar1) {
    FShaderProgram::Compile(&this->mShader,Vertex,"shaders/glsl/screenquad.vp","",0x14a);
    FShaderProgram::Compile(&this->mShader,Fragment,"shaders/glsl/fxaa.fp","",0x14a);
    FShaderProgram::SetFragDataLocation(&this->mShader,0,"FragColor");
    FShaderProgram::Link(&this->mShader,"shaders/glsl/fxaa");
    FShaderProgram::SetAttribLocation(&this->mShader,0,"PositionInProjection");
    GVar2 = FShaderProgram::operator_cast_to_unsigned_int(&this->mShader);
    FBufferedUniform1i::Init(&this->InputTexture,GVar2,"InputTexture");
    GVar2 = FShaderProgram::operator_cast_to_unsigned_int(&this->mShader);
    FBufferedUniform2f::Init(&this->Resolution,GVar2,"Resolution");
  }
  FShaderProgram::Bind(&this->mShader);
  return;
}

Assistant:

void FFXAAShader::Bind()
{
	if (!mShader)
	{
		mShader.Compile(FShaderProgram::Vertex, "shaders/glsl/screenquad.vp", "", 330);
		mShader.Compile(FShaderProgram::Fragment, "shaders/glsl/fxaa.fp", "", 330);
		mShader.SetFragDataLocation(0, "FragColor");
		mShader.Link("shaders/glsl/fxaa");
		mShader.SetAttribLocation(0, "PositionInProjection");
		InputTexture.Init(mShader, "InputTexture");
		Resolution.Init(mShader, "Resolution");
	}

	mShader.Bind();
}